

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O0

void point_edwards2legacy(pt_prj_t_conflict4 *Q,pt_prj_t_conflict4 *P)

{
  uint64_t *arg2;
  uint64_t *arg1;
  long in_RSI;
  long in_RDI;
  limb_t *Z3;
  limb_t *T3;
  limb_t *Y3;
  limb_t *X3;
  limb_t *Z1;
  limb_t *Y1;
  limb_t *X1;
  limb_t *S;
  limb_t *T;
  fe_t_conflict1 t0;
  uint64_t *in_stack_00000b30;
  uint64_t *in_stack_00000b38;
  uint64_t *in_stack_00000b40;
  uint64_t local_68 [13];
  
  arg2 = (uint64_t *)(in_RSI + 0x50);
  arg1 = (uint64_t *)(in_RSI + 0xf0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add((uint64_t *)(in_RDI + 0xa0),arg1,arg2);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(arg2,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(local_68,arg1,arg2);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(arg2,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000b40,in_stack_00000b38,in_stack_00000b30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000b40,in_stack_00000b38,in_stack_00000b30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000b40,in_stack_00000b38,in_stack_00000b30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000b40,in_stack_00000b38,in_stack_00000b30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(local_68,(uint64_t *)(in_RDI + 0xa0),local_68);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(arg2,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000b40,in_stack_00000b38,in_stack_00000b30);
  return;
}

Assistant:

static void point_edwards2legacy(pt_prj_t *Q, const pt_prj_t *P) {
    /* temporary variables */
    fe_t t0;
    /* constants */
    const limb_t *T = const_T;
    const limb_t *S = const_S;
    const limb_t *X1 = P->X;
    const limb_t *Y1 = P->Y;
    const limb_t *Z1 = P->Z;
    limb_t *X3 = Q->X;
    limb_t *Y3 = Q->Y;
    limb_t *T3 = Q->T;
    limb_t *Z3 = Q->Z;

    /* the curve arith formula */
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_add(T3, Z1, Y1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_sub(t0, Z1, Y1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(T3, S, T3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Y3, Z1, T3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Z3, X1, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t0, t0, T);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_add(t0, T3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(X3, X1, t0);
}